

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O0

void __thiscall
helics::FederateInfo::loadInfoFromArgsIgnoreOutput(FederateInfo *this,int argc,char **argv)

{
  ParseOutput PVar1;
  undefined8 uVar2;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *in_RDI;
  ParseOutput ret;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> app;
  App *in_stack_00000068;
  FederateInfo *in_stack_00000070;
  int *in_stack_00000078;
  helicsCLI11App *in_stack_00000080;
  FederateInfo *in_stack_00001f88;
  char *in_stack_ffffffffffffffb8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc0;
  string_view in_stack_ffffffffffffffc8;
  
  makeCLIApp(in_stack_00001f88);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x3665d0);
  PVar1 = helicsCLI11App::helics_parse<int&,char**&>
                    (in_stack_00000080,in_stack_00000078,(char ***)in_stack_00000070);
  if (PVar1 == PARSE_ERROR) {
    uVar2 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    InvalidParameter::InvalidParameter
              ((InvalidParameter *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
    __cxa_throw(uVar2,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
  }
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::get
            (in_RDI);
  config_additional(in_stack_00000070,in_stack_00000068);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  ~unique_ptr((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
              in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void FederateInfo::loadInfoFromArgsIgnoreOutput(int argc, char* argv[])
{
    auto app = makeCLIApp();
    auto ret = app->helics_parse(argc, argv);
    if (ret == helicsCLI11App::ParseOutput::PARSE_ERROR) {
        throw helics::InvalidParameter("argument parsing failed");
    }
    config_additional(app.get());
}